

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O1

idx_t __thiscall
duckdb::roaring::ContainerMetadata::GetDataSizeInBytes(ContainerMetadata *this,idx_t container_size)

{
  ushort uVar1;
  ulong uVar2;
  
  if (this->container_type == RUN_CONTAINER) {
    uVar1 = this->count;
    uVar2 = (ulong)((uint)uVar1 * 4);
    if (3 < uVar1) {
      uVar2 = (ulong)uVar1 * 2 + 8;
    }
    return uVar2;
  }
  if (this->container_type == BITSET_CONTAINER) {
    return container_size >> 3 & 0xfffffffffffffff8;
  }
  uVar1 = this->count;
  uVar2 = (ulong)((uint)uVar1 + (uint)uVar1);
  if (7 < uVar1) {
    uVar2 = (ulong)uVar1 + 8;
  }
  return uVar2;
}

Assistant:

bool IsUncompressed() const {
		return container_type == ContainerType::BITSET_CONTAINER;
	}